

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUISkin::draw3DButtonPaneStandard
          (CGUISkin *this,IGUIElement *element,rect<int> *r,rect<int> *clip)

{
  IVideoDriver *pIVar1;
  int iVar2;
  SColor SVar3;
  uint uVar4;
  SColor c1;
  SColor local_40;
  SColor local_3c;
  vector2d<int> local_38;
  vector2d<int> vStack_30;
  
  pIVar1 = this->Driver;
  if (pIVar1 != (IVideoDriver *)0x0) {
    local_38 = r->UpperLeftCorner;
    vStack_30 = r->LowerRightCorner;
    if (this->Type == EGST_BURNING_SKIN) {
      local_38.Y = local_38.Y + -1;
      local_38.X = local_38.X + -1;
      vStack_30.Y = vStack_30.Y + 1;
      vStack_30.X = vStack_30.X + 1;
      local_3c.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0x11);
      local_40.color = 0xffffffff;
      SVar3 = video::SColor::getInterpolated(&local_3c,&local_40,0.9);
      (*(this->super_IGUISkin)._vptr_IGUISkin[0xe])
                (this,element,(ulong)SVar3.color,0,1,&local_38,clip);
    }
    else {
      uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar4,&local_38,clip);
      vStack_30.X = vStack_30.X + -1;
      vStack_30.Y = vStack_30.Y + -1;
      pIVar1 = this->Driver;
      uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar4,&local_38,clip);
      iVar2 = local_38.Y;
      local_38.X = local_38.X + 1;
      local_38.Y = iVar2 + 1;
      pIVar1 = this->Driver;
      uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar4,&local_38,clip);
      vStack_30 = (vector2d<int>)CONCAT44(vStack_30.Y + -1,vStack_30.X + -1);
      if (this->UseGradient == false) {
        pIVar1 = this->Driver;
        uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
        (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar4,&local_38,clip);
      }
      else {
        local_3c.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
        local_40.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0);
        SVar3 = video::SColor::getInterpolated(&local_3c,&local_40,0.4);
        (*this->Driver->_vptr_IVideoDriver[0x34])
                  (this->Driver,&local_38,(ulong)local_3c.color,(ulong)local_3c.color,
                   (ulong)SVar3.color,(ulong)SVar3.color,clip);
      }
    }
  }
  return;
}

Assistant:

void CGUISkin::draw3DButtonPaneStandard(IGUIElement *element,
		const core::rect<s32> &r,
		const core::rect<s32> *clip)
{
	if (!Driver)
		return;

	core::rect<s32> rect = r;

	if (Type == EGST_BURNING_SKIN) {
		rect.UpperLeftCorner.X -= 1;
		rect.UpperLeftCorner.Y -= 1;
		rect.LowerRightCorner.X += 1;
		rect.LowerRightCorner.Y += 1;
		draw3DSunkenPane(element,
				getColor(EGDC_WINDOW).getInterpolated(0xFFFFFFFF, 0.9f), false, true, rect, clip);
		return;
	}

	Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);

	rect.LowerRightCorner.X -= 1;
	rect.LowerRightCorner.Y -= 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);

	rect.UpperLeftCorner.X += 1;
	rect.UpperLeftCorner.Y += 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);

	rect.LowerRightCorner.X -= 1;
	rect.LowerRightCorner.Y -= 1;

	if (!UseGradient) {
		Driver->draw2DRectangle(getColor(EGDC_3D_FACE), rect, clip);
	} else {
		const video::SColor c1 = getColor(EGDC_3D_FACE);
		const video::SColor c2 = c1.getInterpolated(getColor(EGDC_3D_DARK_SHADOW), 0.4f);
		Driver->draw2DRectangle(rect, c1, c1, c2, c2, clip);
	}
}